

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MaterialSystem.cpp
# Opt level: O1

aiReturn aiGetMaterialString(aiMaterial *pMat,char *pKey,uint type,uint index,aiString *pOut)

{
  ai_uint32 aVar1;
  Logger *this;
  long *plVar2;
  long *plVar3;
  aiReturn aVar4;
  aiMaterialProperty *prop;
  allocator<char> local_89;
  long *local_88;
  long local_80;
  long local_78;
  long lStack_70;
  long *local_68;
  long local_60;
  long local_58;
  long lStack_50;
  long *local_48 [2];
  long local_38 [2];
  aiMaterialProperty *local_28;
  
  if (pOut == (aiString *)0x0) {
    __assert_fail("pOut != __null",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/Material/MaterialSystem.cpp"
                  ,0x127,
                  "aiReturn aiGetMaterialString(const aiMaterial *, const char *, unsigned int, unsigned int, aiString *)"
                 );
  }
  aiGetMaterialProperty(pMat,pKey,type,index,&local_28);
  aVar4 = aiReturn_FAILURE;
  if (local_28 != (aiMaterialProperty *)0x0) {
    if (local_28->mType == aiPTI_String) {
      if (local_28->mDataLength < 5) {
        __assert_fail("prop->mDataLength>=5",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/Material/MaterialSystem.cpp"
                      ,0x130,
                      "aiReturn aiGetMaterialString(const aiMaterial *, const char *, unsigned int, unsigned int, aiString *)"
                     );
      }
      aVar1 = *(ai_uint32 *)local_28->mData;
      pOut->length = aVar1;
      if (aVar1 + 5 != local_28->mDataLength) {
        __assert_fail("pOut->length+1+4==prop->mDataLength",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/Material/MaterialSystem.cpp"
                      ,0x135,
                      "aiReturn aiGetMaterialString(const aiMaterial *, const char *, unsigned int, unsigned int, aiString *)"
                     );
      }
      if (local_28->mData[local_28->mDataLength - 1] != '\0') {
        __assert_fail("!prop->mData[ prop->mDataLength - 1 ]",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/Material/MaterialSystem.cpp"
                      ,0x136,
                      "aiReturn aiGetMaterialString(const aiMaterial *, const char *, unsigned int, unsigned int, aiString *)"
                     );
      }
      memcpy(pOut->data,local_28->mData + 4,(ulong)(aVar1 + 1));
      aVar4 = aiReturn_SUCCESS;
    }
    else {
      this = Assimp::DefaultLogger::get();
      std::__cxx11::string::string<std::allocator<char>>((string *)local_48,pKey,&local_89);
      plVar2 = (long *)std::__cxx11::string::replace((ulong)local_48,0,(char *)0x0,0x6c7e8f);
      plVar3 = plVar2 + 2;
      if ((long *)*plVar2 == plVar3) {
        local_58 = *plVar3;
        lStack_50 = plVar2[3];
        local_68 = &local_58;
      }
      else {
        local_58 = *plVar3;
        local_68 = (long *)*plVar2;
      }
      local_60 = plVar2[1];
      *plVar2 = (long)plVar3;
      plVar2[1] = 0;
      *(undefined1 *)(plVar2 + 2) = 0;
      plVar2 = (long *)std::__cxx11::string::append((char *)&local_68);
      plVar3 = plVar2 + 2;
      if ((long *)*plVar2 == plVar3) {
        local_78 = *plVar3;
        lStack_70 = plVar2[3];
        local_88 = &local_78;
      }
      else {
        local_78 = *plVar3;
        local_88 = (long *)*plVar2;
      }
      local_80 = plVar2[1];
      *plVar2 = (long)plVar3;
      plVar2[1] = 0;
      *(undefined1 *)(plVar2 + 2) = 0;
      Assimp::Logger::error(this,(char *)local_88);
      if (local_88 != &local_78) {
        operator_delete(local_88,local_78 + 1);
      }
      if (local_68 != &local_58) {
        operator_delete(local_68,local_58 + 1);
      }
      if (local_48[0] != local_38) {
        operator_delete(local_48[0],local_38[0] + 1);
      }
    }
  }
  return aVar4;
}

Assistant:

aiReturn aiGetMaterialString(const aiMaterial* pMat,
    const char* pKey,
    unsigned int type,
    unsigned int index,
    aiString* pOut)
{
    ai_assert (pOut != NULL);

    const aiMaterialProperty* prop;
    aiGetMaterialProperty(pMat,pKey,type,index,(const aiMaterialProperty**)&prop);
    if (!prop) {
        return AI_FAILURE;
    }

    if( aiPTI_String == prop->mType) {
        ai_assert(prop->mDataLength>=5);

        // The string is stored as 32 but length prefix followed by zero-terminated UTF8 data
        pOut->length = static_cast<unsigned int>(*reinterpret_cast<uint32_t*>(prop->mData));

        ai_assert( pOut->length+1+4==prop->mDataLength );
        ai_assert( !prop->mData[ prop->mDataLength - 1 ] );
        memcpy(pOut->data,prop->mData+4,pOut->length+1);
    }
    else {
        // TODO - implement lexical cast as well
        ASSIMP_LOG_ERROR("Material property" + std::string(pKey) +
            " was found, but is no string" );
        return AI_FAILURE;
    }
    return AI_SUCCESS;
}